

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O1

ChannelList *
anon_unknown.dwarf_24ed2e::setupBuffer
          (ChannelList *__return_storage_ptr__,Header *hdr,char **channels,char **passivechannels,
          PixelType *pt,FrameBuffer *buf,FrameBuffer *prereadbuf,FrameBuffer *postreadbuf,int banks,
          bool writing)

{
  _Rb_tree_header *p_Var1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  Box2i *pBVar11;
  undefined8 *puVar12;
  size_t xst;
  size_t yst;
  bool bVar13;
  long *plVar14;
  int iVar15;
  PixelType PVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  vector<char,_std::allocator<char>_> *this;
  undefined1 xtc;
  char *pcVar21;
  uint uVar22;
  undefined4 *puVar23;
  undefined4 *puVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  Slice local_68;
  ulong uVar20;
  
  pBVar11 = Imf_2_5::Header::dataWindow(hdr);
  iVar3 = (pBVar11->min).x;
  iVar4 = (pBVar11->min).y;
  iVar18 = (pBVar11->max).x;
  lVar17 = 0;
  if (*channels == (char *)0x0) {
    bVar13 = false;
    iVar9 = 0;
    uVar25 = 0;
  }
  else {
    iVar9 = 0;
    bVar13 = false;
    uVar19 = 0;
    do {
      if (pt == (PixelType *)0x0) {
LAB_0018259d:
        iVar9 = iVar9 + 2;
      }
      else {
        PVar16 = pt[uVar19];
        if ((PVar16 != UINT) && (PVar16 != FLOAT)) {
          if (PVar16 == HALF) goto LAB_0018259d;
          goto LAB_00182a29;
        }
        iVar9 = iVar9 + (-iVar9 & 3U) + 4;
        bVar13 = true;
      }
      uVar25 = uVar19 + 1;
      lVar8 = uVar19 + 1;
      uVar19 = uVar25;
    } while (channels[lVar8] != (char *)0x0);
  }
  uVar19 = uVar25 & 0xffffffff;
  if (passivechannels == (char **)0x0) {
LAB_0018262d:
    uVar22 = -iVar9 & 3;
    if (!bVar13) {
      uVar22 = 0;
    }
    iVar9 = uVar22 + iVar9;
    uVar22 = (int)lVar17 + (int)uVar25;
    pBVar11 = Imf_2_5::Header::dataWindow(hdr);
    iVar15 = (pBVar11->max).x;
    pBVar11 = Imf_2_5::Header::dataWindow(hdr);
    iVar5 = (pBVar11->min).x;
    pBVar11 = Imf_2_5::Header::dataWindow(hdr);
    iVar6 = (pBVar11->max).y;
    pBVar11 = Imf_2_5::Header::dataWindow(hdr);
    iVar15 = ((iVar15 - iVar5) + 1) * uVar22 * ((iVar6 - (pBVar11->min).y) + 1);
    this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer;
    if (writing) {
      this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::writingBuffer;
    }
    std::vector<char,_std::allocator<char>_>::resize(this,(long)(iVar15 * iVar9));
    if (0 < iVar15) {
      puVar12 = &(anonymous_namespace)::readingBuffer;
      if (writing) {
        puVar12 = &(anonymous_namespace)::writingBuffer;
      }
      puVar23 = (undefined4 *)*puVar12;
      uVar26 = 0;
      do {
        uVar10 = random_int(0xffff);
        if ((pt == (PixelType *)0x0) || (pt[(int)uVar26] == HALF)) {
          *(short *)puVar23 = (short)uVar10;
          puVar23 = (undefined4 *)((long)puVar23 + 2);
        }
        else {
          puVar24 = (undefined4 *)((long)puVar23 + (ulong)(-(int)puVar23 & 3));
          puVar23 = puVar24 + 1;
          *puVar24 = *(undefined4 *)((long)&half::_toFloat + (ulong)(uVar10 & 0xffff) * 4);
        }
        uVar26 = uVar26 + 1;
        if (uVar26 == uVar22) {
          uVar26 = 0;
        }
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
    }
    if (!writing) {
      std::vector<char,_std::allocator<char>_>::operator=
                ((vector<char,_std::allocator<char>_> *)(anonymous_namespace)::preReadBuffer,
                 (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer);
    }
    p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar18 = iVar9 * ((iVar18 - iVar3) + 1);
    if (uVar22 != 0) {
      xst = (size_t)(iVar9 / banks);
      yst = (size_t)iVar18;
      ppcVar2 = passivechannels + -(long)(int)uVar25;
      uVar25 = 0;
      pcVar21 = (char *)0x0;
      do {
        PVar16 = HALF;
        if (pt != (PixelType *)0x0) {
          PVar16 = pt[uVar25];
        }
        if (uVar25 < uVar19 && writing) {
          pcVar7 = channels[uVar25];
          Imf_2_5::Channel::Channel((Channel *)&local_68,PVar16,1,1,false);
          Imf_2_5::ChannelList::insert(__return_storage_ptr__,pcVar7,(Channel *)&local_68);
        }
        uVar20 = 0;
        uVar26 = (int)uVar25 >> 0x1f;
        if ((int)((long)((ulong)uVar26 << 0x20 | uVar25 & 0xffffffff) % (long)((int)uVar22 / banks))
            == 0) {
          plVar14 = &(anonymous_namespace)::readingBuffer;
          if (writing) {
            plVar14 = &(anonymous_namespace)::writingBuffer;
          }
          pcVar21 = (char *)(((long)((int)((long)((ulong)uVar26 << 0x20 | uVar25 & 0xffffffff) /
                                          (long)((int)uVar22 / banks)) * (iVar18 / banks)) +
                             *plVar14) - (long)(iVar4 * iVar18 + iVar3 * (iVar9 / banks)));
        }
        uVar27 = (ulong)(-(int)pcVar21 & 3);
        if ((PVar16 & ~FLOAT) != UINT) {
          uVar27 = uVar20;
        }
        pcVar21 = pcVar21 + uVar27;
        if (uVar25 < uVar19) {
          pcVar7 = channels[uVar25];
          iVar15 = (int)uVar25 + 100;
          Imf_2_5::Slice::Slice
                    (&local_68,PVar16,pcVar21,xst,yst,1,1,(double)iVar15,false,SUB41(iVar15,0));
          Imf_2_5::FrameBuffer::insert(buf,pcVar7,&local_68);
        }
        else if (!writing) {
          pcVar7 = ppcVar2[uVar25];
          Imf_2_5::Slice::Slice(&local_68,PVar16,pcVar21,xst,yst,1,1,0.4,false,SUB81(ppcVar2,0));
          xtc = (undefined1)uVar20;
          Imf_2_5::FrameBuffer::insert(postreadbuf,pcVar7,&local_68);
          pcVar7 = ppcVar2[uVar25];
          Imf_2_5::Slice::Slice
                    (&local_68,PVar16,
                     pcVar21 + ((anonymous_namespace)::preReadBuffer._0_8_ -
                               (anonymous_namespace)::readingBuffer),xst,yst,1,1,0.4,(bool)xtc,false
                    );
          Imf_2_5::FrameBuffer::insert(prereadbuf,pcVar7,&local_68);
        }
        lVar17 = 2;
        if (PVar16 != HALF) {
          if (PVar16 != FLOAT) {
            std::operator<<((ostream *)&std::cout,"Unexpected Pixel Type\n");
            goto LAB_00182a3c;
          }
          lVar17 = 4;
        }
        pcVar21 = pcVar21 + lVar17;
        uVar25 = uVar25 + 1;
      } while (uVar22 != uVar25);
    }
    return __return_storage_ptr__;
  }
  lVar17 = 0;
LAB_001825f1:
  if (passivechannels[lVar17] == (char *)0x0) goto LAB_0018262d;
  if (pt == (PixelType *)0x0) {
LAB_00182612:
    iVar9 = iVar9 + 2;
  }
  else {
    PVar16 = pt[uVar19 + lVar17];
    if ((PVar16 != UINT) && (PVar16 != FLOAT)) {
      if (PVar16 == HALF) goto LAB_00182612;
LAB_00182a29:
      std::operator<<((ostream *)&std::cout,"Unexpected PixelType?\n");
LAB_00182a3c:
      exit(1);
    }
    iVar9 = iVar9 + (-iVar9 & 3U) + 4;
    bVar13 = true;
  }
  lVar17 = lVar17 + 1;
  if (passivechannels == (char **)0x0) goto LAB_0018262d;
  goto LAB_001825f1;
}

Assistant:

ChannelList
setupBuffer (const Header& hdr,       // header to grab datawindow from
             const char * const *channels, // NULL terminated list of channels to write
             const char * const *passivechannels, // NULL terminated list of channels to write
             const PixelType* pt,     // type of each channel, or NULL for all HALF
             FrameBuffer& buf,        // buffer to fill with pointers to channel
             FrameBuffer& prereadbuf, // channels which aren't being read - indexes into the preread buffer
             FrameBuffer& postreadbuf, // channels which aren't being read - indexes into the postread buffer
             int banks,                    // number of banks - channels within each bank are interleaved, banks are scanline interleaved
             bool writing                  // true if should allocate
            )
{
    Box2i dw = hdr.dataWindow();

    //
    // how many channels in total
    //
    int activechans = 0;
    int bytes_per_pixel =0;
    bool has32BitValue = false;
    while (channels[activechans]!=NULL)
    {
        if (pt==NULL)
        {
            bytes_per_pixel+=2;
        }
        else
        {
            switch (pt[activechans])
            {
                case IMF::HALF : bytes_per_pixel+=2;break;
                case IMF::FLOAT : case IMF::UINT : 
                    // some architectures (e.g arm7 cannot write 32 bit values
                    // to addresses which aren't aligned to 32 bit addresses)
                    // so bump to next multiple of four
                    bytes_per_pixel =  alignToFour(bytes_per_pixel);
                    bytes_per_pixel+=4;
                    has32BitValue = true;
                    break;
                    
                default :
                    cout << "Unexpected PixelType?\n";
                    exit(1);
            }
        }
        activechans++;
    }

    
    int passivechans=0;
    while (passivechannels!=NULL && passivechannels[passivechans]!=NULL)
    {
        if (pt==NULL)
        {
            bytes_per_pixel+=2;
        }
        else
        {
            switch (pt[passivechans+activechans])
            {
                case IMF::HALF : bytes_per_pixel+=2;break;
                case IMF::FLOAT : case IMF::UINT : 
                    bytes_per_pixel =  alignToFour(bytes_per_pixel);
                    bytes_per_pixel+=4;
                    has32BitValue = true;
                    break;
                default :
                    cout << "Unexpected PixelType?\n";
                    exit(1);
            }
        }
        passivechans++;
    }
    
    if(has32BitValue)
    {
        bytes_per_pixel = alignToFour(bytes_per_pixel);
    }

   int chans = activechans+passivechans;

    
    int bytes_per_bank = bytes_per_pixel/banks;
    
    int samples = (hdr.dataWindow().max.x+1-hdr.dataWindow().min.x)*
                  (hdr.dataWindow().max.y+1-hdr.dataWindow().min.y)*chans;

    int size = samples*bytes_per_pixel;

    
    if (writing)
    {
        writingBuffer.resize(size);
    }
    else
    {
        readingBuffer.resize(size);
    }
   
     const char * write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
     // fill with random halfs, casting to floats for float channels
     int chan=0;
     for (int i=0;i<samples;i++)
     {
         unsigned short int values = random_int(std::numeric_limits<unsigned short>::max());
         half v;
         v.setBits(values);
         if (pt==NULL || pt[chan]==IMF::HALF)
         {
             *(half*)write_ptr = half(v);
             write_ptr+=2;
         }
         else
         {
             write_ptr = alignToFour(write_ptr);
             *(float*)write_ptr = float(v);
             
             write_ptr+=4;
         }
         chan++;
         if (chan==chans)
         {
             chan=0;
         }
     
     }

     if (!writing)
     {
         //take a copy of the buffer as it was before being read
         preReadBuffer = readingBuffer;
     }
     
    char* offset=NULL;

    ChannelList chanlist;

    int bytes_per_row = bytes_per_pixel*(dw.max.x+1-dw.min.x);
    int bytes_per_bank_row = bytes_per_row/banks;
    
    int first_pixel_index = bytes_per_row*dw.min.y+bytes_per_bank*dw.min.x;
    
    for (int i=0;i<chans;i++)
    {
        PixelType type = pt==NULL ? IMF::HALF : pt[i];
        if (i<activechans && writing)
        {
            chanlist.insert(channels[i],type);
        }


        if (i % (chans/banks) ==0)
        {
            //
            // set offset pointer to beginning of bank
            //

            int bank = i / (chans/banks);
            offset = (writing ? &writingBuffer[0] :
                                &readingBuffer[0]) + bank*bytes_per_bank_row - first_pixel_index;
        }
       

         if(type==FLOAT || type==UINT)
         {
           offset = alignToFour(offset);
         }
 
        if (i<activechans)
        {
            
            buf.insert (channels[i],
                        Slice (type,
                               offset,
                               bytes_per_bank,
                               bytes_per_row,
                               1,1,100+i));
        }
        else
        {
            if (!writing)
            {
                
                postreadbuf.insert (passivechannels[i-activechans],
                                    Slice (type,
                                           offset,
                                           bytes_per_bank,
                                           bytes_per_row,
                                           1,1,0.4));

                char * pre_offset = offset-&readingBuffer[0]+&preReadBuffer[0];
 
                prereadbuf.insert (passivechannels[i-activechans],
                                   Slice (type,
                                          pre_offset,
                                          bytes_per_bank,
                                          bytes_per_row,
                                          1,1,0.4));
            }
        }
        switch (type)
        {
            case IMF::HALF :
                offset+=2;
                break;
            case IMF::FLOAT :
                offset+=4;
                break;
            default :
                cout << "Unexpected Pixel Type\n";
                exit(1);
        
        }
    }

    return chanlist;
}